

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall
TestParser_TestIdentifier_Test::~TestParser_TestIdentifier_Test
          (TestParser_TestIdentifier_Test *this)

{
  TestParser_TestIdentifier_Test *this_local;
  
  ~TestParser_TestIdentifier_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestParser, TestIdentifier) {
    Parser parser(Lexer("a"));
    std::unique_ptr<AST::Stmt> stmt = parser.parse();
    auto* exprStmt = dynamic_cast<AST::ExprStmt*>(stmt.get());
    std::unique_ptr<AST::Expr> subExpr = std::move(exprStmt->m_expr);
    auto* ident = dynamic_cast<AST::Identifier*>(subExpr.get());
    ASSERT_EQ(ident->m_identStr, "a");
}